

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O1

void secp256k1_sha256_finalize(secp256k1_sha256 *hash,uchar *out32)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  long extraout_RDX;
  uchar sizedesc [8];
  byte bStack_b1;
  secp256k1_sha256 sStack_b0;
  uchar local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  char local_19;
  
  uVar2 = hash->bytes;
  if (uVar2 >> 0x3d == 0) {
    local_1d = (undefined1)(uVar2 >> 0x1d);
    local_1e = (undefined1)(uVar2 >> 0x25);
    local_1f = (undefined1)(uVar2 >> 0x2d);
    local_20 = (uchar)(uVar2 >> 0x35);
    local_19 = (char)uVar2 * '\b';
    local_1a = (undefined1)(uVar2 >> 5);
    local_1b = (undefined1)(uVar2 >> 0xd);
    local_1c = (undefined1)(uVar2 >> 0x15);
    secp256k1_sha256_write
              (hash,secp256k1_sha256_finalize::pad,(ulong)(0x37U - (int)uVar2 & 0x3f) + 1);
    secp256k1_sha256_write(hash,&local_20,8);
    lVar3 = 0;
    do {
      uVar1 = hash->s[lVar3];
      *(uint *)(out32 + lVar3 * 4) =
           uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      hash->s[lVar3] = 0;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    return;
  }
  secp256k1_sha256_finalize_cold_1();
  bStack_b1 = *(byte *)(extraout_RDX + 0x1f) & 1 | 2;
  sStack_b0.s[0] = 0x6a09e667;
  sStack_b0.s[1] = 0xbb67ae85;
  sStack_b0.s[2] = 0x3c6ef372;
  sStack_b0.s[3] = 0xa54ff53a;
  sStack_b0.s[4] = 0x510e527f;
  sStack_b0.s[5] = 0x9b05688c;
  sStack_b0.s[6] = 0x1f83d9ab;
  sStack_b0.s[7] = 0x5be0cd19;
  sStack_b0.bytes = 0;
  secp256k1_sha256_write(&sStack_b0,&bStack_b1,1);
  secp256k1_sha256_write(&sStack_b0,out32,0x20);
  secp256k1_sha256_finalize(&sStack_b0,(uchar *)hash);
  return;
}

Assistant:

static void secp256k1_sha256_finalize(secp256k1_sha256 *hash, unsigned char *out32) {
    static const unsigned char pad[64] = {0x80};
    unsigned char sizedesc[8];
    int i;
    /* The maximum message size of SHA256 is 2^64-1 bits. */
    VERIFY_CHECK(hash->bytes < ((uint64_t)1 << 61));
    secp256k1_write_be32(&sizedesc[0], hash->bytes >> 29);
    secp256k1_write_be32(&sizedesc[4], hash->bytes << 3);
    secp256k1_sha256_write(hash, pad, 1 + ((119 - (hash->bytes % 64)) % 64));
    secp256k1_sha256_write(hash, sizedesc, 8);
    for (i = 0; i < 8; i++) {
        secp256k1_write_be32(&out32[4*i], hash->s[i]);
        hash->s[i] = 0;
    }
}